

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void decode_partition(AV1Decoder *pbi,ThreadData *td,int mi_row,int mi_col,aom_reader *reader,
                     BLOCK_SIZE bsize,int parse_decode_flag)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  aom_cdf_prob aVar4;
  int iVar5;
  RestorationType RVar6;
  RestorationUnitInfo *pRVar7;
  MB_MODE_INFO **ppMVar8;
  FRAME_CONTEXT *pFVar9;
  BLOCK_SIZE BVar10;
  short sVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  char cVar19;
  byte bVar20;
  ulong uVar21;
  uint7 uVar22;
  uint uVar23;
  long lVar24;
  undefined4 uVar25;
  undefined7 in_register_00000089;
  ulong uVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  RestorationInfo *pRVar31;
  int rcol0;
  SgrprojInfo *local_b8;
  undefined4 local_ac;
  WienerInfo *local_a8;
  ulong local_a0;
  long local_98;
  int rrow1;
  int rrow0;
  int rcol1;
  RestorationInfo *local_80;
  long local_78;
  SgrprojInfo *local_70;
  WienerInfo *local_68;
  AV1Common *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar26 = CONCAT71(in_register_00000089,bsize);
  uVar25 = (undefined4)uVar26;
  uVar21 = uVar26 & 0xffffffff;
  uVar26 = uVar26 & 0xffffffff;
  bVar20 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar26];
  get_partition_subsize(bsize,'\x03');
  iVar15 = (pbi->common).mi_params.mi_rows;
  iVar5 = (pbi->common).mi_params.mi_cols;
  if (iVar5 <= mi_col || iVar15 <= mi_row) {
    return;
  }
  uVar23 = (uint)(bVar20 >> 1);
  iVar30 = uVar23 + mi_row;
  iVar28 = uVar23 + mi_col;
  local_ac = uVar25;
  local_a0 = uVar26;
  if ((parse_decode_flag & 1U) == 0) {
    iVar28 = (pbi->common).mi_params.mi_stride;
    ppMVar8 = (pbi->common).mi_params.mi_grid_base;
    lVar17 = (long)(iVar28 * mi_row + mi_col);
    BVar10 = ppMVar8[lVar17]->bsize;
    if (BVar10 != (BLOCK_SIZE)uVar21) {
      bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar26];
      bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar10];
      bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar10];
      if ((BLOCK_8X8 < (BLOCK_SIZE)uVar21) && (iVar30 < iVar15)) {
        uVar14 = (uint)(bVar1 >> 1) + mi_col;
        uVar21 = (ulong)uVar14;
        if ((int)uVar14 < iVar5) {
          uVar22 = (uint7)(uint3)(uVar14 >> 8);
          if (bVar3 != bVar20) {
            if (bVar2 == bVar1) {
              uVar14 = (uint)CONCAT71(uVar22,9);
              if ((uint)bVar3 << 2 != (uint)bVar20) {
                uVar14 = (uint)(ppMVar8[lVar17 + (ulong)uVar23]->bsize != BVar10) * 5 + 2;
              }
            }
            else {
              uVar14 = (uint)CONCAT71(uVar22,3);
              if (((uint)bVar2 * 2 == (uint)bVar1 && (uint)bVar3 * 2 == (uint)bVar20) &&
                 (uVar14 = (uint)CONCAT71(uVar22,4),
                 "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [ppMVar8[lVar17 + (int)((uint)(bVar1 >> 1) * iVar28)]->bsize] != bVar20)) {
                uVar14 = (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [ppMVar8[lVar17 + (ulong)uVar23]->bsize] == bVar1) * 3 + 3;
              }
            }
            goto LAB_0016662b;
          }
          uVar14 = (uint)CONCAT71(uVar22,8);
          if ((uint)bVar2 << 2 == (uint)bVar1) goto LAB_0016662b;
          cVar19 = (ppMVar8[lVar17 + (int)((uint)(bVar1 >> 1) * iVar28)]->bsize != BVar10) << 2;
          goto LAB_00166caf;
        }
      }
      uVar14 = (uint)CONCAT71((int7)(uVar21 >> 8),
                              get_partition::base_partitions
                              [(ulong)(bVar2 < bVar1) + (ulong)(bVar3 < bVar20) * 2]);
      goto LAB_0016662b;
    }
  }
  else {
    local_60 = &pbi->common;
    local_80 = (pbi->common).rst_info;
    local_68 = (td->dcb).xd.wiener_info;
    local_70 = (td->dcb).xd.sgrproj_info;
    local_58 = (ulong)(((pbi->common).seq_params)->monochrome == '\0') * 2 + 1;
    lVar17 = 0;
    while (lVar17 != local_58) {
      local_98 = lVar17;
      if ((local_80[lVar17].frame_restoration_type != RESTORE_NONE) &&
         (iVar12 = av1_loop_restoration_corners_in_sb
                             (local_60,(int)lVar17,mi_row,mi_col,bsize,&rcol0,&rcol1,&rrow0,&rrow1),
         iVar12 != 0)) {
        pRVar31 = local_80 + lVar17;
        lVar24 = (long)rrow0;
        iVar12 = (uint)(local_98 == 0) * 2 + 5;
        local_a8 = local_68 + local_98;
        local_b8 = local_70 + local_98;
        lVar16 = lVar24 * pRVar31->horz_units * 0x40;
        local_50 = (long)pRVar31->horz_units << 6;
        lVar17 = lVar16 + 0x30;
        local_78 = lVar16 + 0x10;
        while (lVar24 < rrow1) {
          lVar29 = (long)rcol0;
          lVar27 = lVar29 * 0x40;
          uVar21 = lVar16 + lVar27;
          lVar18 = lVar17 + lVar27;
          lVar27 = lVar27 + local_78;
          local_48 = lVar17;
          local_40 = lVar16;
          local_38 = lVar24;
          for (; lVar29 < rcol1; lVar29 = lVar29 + 1) {
            pRVar7 = pRVar31->unit_info;
            RVar6 = pRVar31->frame_restoration_type;
            if (RVar6 == RESTORE_WIENER) {
              iVar13 = aom_read_symbol_(reader,((td->dcb).xd.tile_ctx)->wiener_restore_cdf,2);
              if (iVar13 == 0) {
LAB_001663f4:
                *(undefined4 *)((long)(pRVar7->wiener_info).vfilter + (uVar21 - 0x10)) = 0;
              }
              else {
                *(undefined4 *)((long)(pRVar7->wiener_info).vfilter + (uVar21 - 0x10)) = 1;
                read_wiener_filter(iVar12,(WienerInfo *)
                                          ((long)(pRVar7->wiener_info).vfilter + lVar27 + -0x10),
                                   local_a8,reader);
              }
            }
            else if (RVar6 == RESTORE_SGRPROJ) {
              iVar13 = aom_read_symbol_(reader,((td->dcb).xd.tile_ctx)->sgrproj_restore_cdf,2);
              if (iVar13 == 0) goto LAB_001663f4;
              *(undefined4 *)((long)(pRVar7->wiener_info).vfilter + (uVar21 - 0x10)) = 2;
              read_sgrproj_filter((SgrprojInfo *)
                                  ((long)(pRVar7->wiener_info).vfilter + lVar18 + -0x10),local_b8,
                                  reader);
            }
            else if (RVar6 == RESTORE_SWITCHABLE) {
              iVar13 = aom_read_symbol_(reader,((td->dcb).xd.tile_ctx)->switchable_restore_cdf,3);
              *(int *)((long)(pRVar7->wiener_info).vfilter + (uVar21 - 0x10)) = iVar13;
              if (iVar13 == 2) {
                read_sgrproj_filter((SgrprojInfo *)
                                    ((long)(pRVar7->wiener_info).vfilter + lVar18 + -0x10),local_b8,
                                    reader);
              }
              else if (iVar13 == 1) {
                read_wiener_filter(iVar12,(WienerInfo *)
                                          ((long)(pRVar7->wiener_info).vfilter + lVar27 + -0x10),
                                   local_a8,reader);
              }
            }
            uVar21 = uVar21 + 0x40;
            lVar18 = lVar18 + 0x40;
            lVar27 = lVar27 + 0x40;
          }
          lVar16 = local_40 + local_50;
          lVar17 = local_48 + local_50;
          local_78 = local_78 + local_50;
          lVar24 = local_38 + 1;
        }
      }
      lVar17 = local_98 + 1;
    }
    bVar20 = (byte)local_ac;
    if (2 < bVar20) {
      uVar22 = (uint7)(uVar21 >> 8);
      uVar14 = (uint)CONCAT71(uVar22,3);
      if (iVar5 <= iVar28 && iVar15 <= iVar30) goto LAB_0016662b;
      lVar17 = (ulong)""[local_a0] - 1;
      lVar17 = (ulong)((uint)(((uint)(int)(td->dcb).xd.above_partition_context[mi_col] >>
                               ((uint)lVar17 & 0x1f) & 1) != 0) +
                      ((uint)(int)(td->dcb).xd.left_partition_context[mi_row & 0x1f] >>
                       ((byte)lVar17 & 0x1f) & 1) * 2) + (ulong)""[local_a0] * 4;
      pFVar9 = (td->dcb).xd.tile_ctx;
      if (iVar30 < iVar15 && iVar28 < iVar5) {
        iVar15 = 4;
        if (bVar20 != 3) {
          iVar15 = (bVar20 != 0xf) + 8 + (uint)(bVar20 != 0xf);
        }
        uVar14 = aom_read_symbol_(reader,pFVar9->partition_cdf[lVar17 + -4],iVar15);
        goto LAB_0016662b;
      }
      if (iVar30 < iVar15 || iVar5 <= iVar28) {
        sVar11 = ((pFVar9->partition_cdf[lVar17 + -4][1] - pFVar9->partition_cdf[lVar17 + -4][0] ^
                  0x8000) - pFVar9->partition_cdf[lVar17 + -4][2]) +
                 pFVar9->partition_cdf[lVar17 + -4][6];
        if (bVar20 != 0xf) {
          sVar11 = (sVar11 - pFVar9->partition_cdf[lVar17 + -4][7]) +
                   pFVar9->partition_cdf[lVar17 + -4][8];
        }
        rcol0 = (int)(ushort)(0x8000 - sVar11);
        iVar15 = od_ec_decode_cdf_q15(&reader->ec,(uint16_t *)&rcol0,2);
        uVar14 = (uint)CONCAT71(uVar22,iVar15 == 0) ^ 3;
        goto LAB_0016662b;
      }
      aVar4 = pFVar9->partition_cdf[lVar17 + -4][2];
      sVar11 = (((aVar4 - pFVar9->partition_cdf[lVar17 + -4][1]) +
                pFVar9->partition_cdf[lVar17 + -4][4]) -
               (aVar4 + pFVar9->partition_cdf[lVar17 + -4][5])) +
               pFVar9->partition_cdf[lVar17 + -4][7] + -0x8000;
      if (bVar20 != 0xf) {
        sVar11 = (sVar11 - pFVar9->partition_cdf[lVar17 + -4][8]) +
                 pFVar9->partition_cdf[lVar17 + -4][9];
      }
      rcol0 = (int)(ushort)(0x8000 - sVar11);
      iVar15 = od_ec_decode_cdf_q15(&reader->ec,(uint16_t *)&rcol0,2);
      cVar19 = (iVar15 != 0) * '\x02';
LAB_00166caf:
      uVar14 = (uint)CONCAT71(uVar22,cVar19 + '\x01');
      goto LAB_0016662b;
    }
  }
  uVar14 = 0;
LAB_0016662b:
  bVar20 = (byte)uVar14;
  BVar10 = get_partition_subsize(bsize,bVar20);
  if (BVar10 == BLOCK_INVALID) {
    (td->dcb).xd.mi_row = mi_row;
    aom_internal_error((td->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,
                       "Partition is invalid for block size %dx%d",(ulong)block_size_wide[local_a0],
                       (ulong)block_size_high[local_a0]);
  }
  if (av1_ss_size_lookup[BVar10][(td->dcb).xd.plane[1].subsampling_x]
      [(td->dcb).xd.plane[1].subsampling_y] == BLOCK_INVALID) {
    (td->dcb).xd.mi_row = mi_row;
    aom_internal_error((td->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,
                       "Block size %dx%d invalid with this subsampling mode",
                       (ulong)block_size_wide[BVar10],(ulong)block_size_high[BVar10]);
  }
  local_a8 = (WienerInfo *)CONCAT44(local_a8._4_4_,uVar14);
  if (9 < bVar20) {
    if ((2 < (byte)local_ac && (parse_decode_flag & 1U) != 0) && (bVar20 < 10)) {
      (*(code *)(&DAT_00425e38 + *(int *)(&DAT_00425e38 + (ulong)bVar20 * 4)))();
      return;
    }
    return;
  }
  (*(code *)(&DAT_00425e10 + *(int *)(&DAT_00425e10 + (ulong)bVar20 * 4)))();
  return;
}

Assistant:

static inline void decode_partition(AV1Decoder *const pbi, ThreadData *const td,
                                    int mi_row, int mi_col, aom_reader *reader,
                                    BLOCK_SIZE bsize, int parse_decode_flag) {
  assert(bsize < BLOCK_SIZES_ALL);
  AV1_COMMON *const cm = &pbi->common;
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  const int bw = mi_size_wide[bsize];
  const int hbs = bw >> 1;
  PARTITION_TYPE partition;
  BLOCK_SIZE subsize;
  const int quarter_step = bw / 4;
  BLOCK_SIZE bsize2 = get_partition_subsize(bsize, PARTITION_SPLIT);
  const int has_rows = (mi_row + hbs) < cm->mi_params.mi_rows;
  const int has_cols = (mi_col + hbs) < cm->mi_params.mi_cols;

  if (mi_row >= cm->mi_params.mi_rows || mi_col >= cm->mi_params.mi_cols)
    return;

  // parse_decode_flag takes the following values :
  // 01 - do parse only
  // 10 - do decode only
  // 11 - do parse and decode
  static const block_visitor_fn_t block_visit[4] = { NULL, parse_decode_block,
                                                     decode_block,
                                                     parse_decode_block };

  if (parse_decode_flag & 1) {
    const int num_planes = av1_num_planes(cm);
    for (int plane = 0; plane < num_planes; ++plane) {
      int rcol0, rcol1, rrow0, rrow1;

      // Skip some unnecessary work if loop restoration is disabled
      if (cm->rst_info[plane].frame_restoration_type == RESTORE_NONE) continue;

      if (av1_loop_restoration_corners_in_sb(cm, plane, mi_row, mi_col, bsize,
                                             &rcol0, &rcol1, &rrow0, &rrow1)) {
        const int rstride = cm->rst_info[plane].horz_units;
        for (int rrow = rrow0; rrow < rrow1; ++rrow) {
          for (int rcol = rcol0; rcol < rcol1; ++rcol) {
            const int runit_idx = rcol + rrow * rstride;
            loop_restoration_read_sb_coeffs(cm, xd, reader, plane, runit_idx);
          }
        }
      }
    }

    partition = (bsize < BLOCK_8X8) ? PARTITION_NONE
                                    : read_partition(xd, mi_row, mi_col, reader,
                                                     has_rows, has_cols, bsize);
  } else {
    partition = get_partition(cm, mi_row, mi_col, bsize);
  }
  subsize = get_partition_subsize(bsize, partition);
  if (subsize == BLOCK_INVALID) {
    // When an internal error occurs ensure that xd->mi_row is set appropriately
    // w.r.t. current tile, which is used to signal processing of current row is
    // done.
    xd->mi_row = mi_row;
    aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Partition is invalid for block size %dx%d",
                       block_size_wide[bsize], block_size_high[bsize]);
  }
  // Check the bitstream is conformant: if there is subsampling on the
  // chroma planes, subsize must subsample to a valid block size.
  const struct macroblockd_plane *const pd_u = &xd->plane[1];
  if (get_plane_block_size(subsize, pd_u->subsampling_x, pd_u->subsampling_y) ==
      BLOCK_INVALID) {
    // When an internal error occurs ensure that xd->mi_row is set appropriately
    // w.r.t. current tile, which is used to signal processing of current row is
    // done.
    xd->mi_row = mi_row;
    aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Block size %dx%d invalid with this subsampling mode",
                       block_size_wide[subsize], block_size_high[subsize]);
  }

#define DEC_BLOCK_STX_ARG
#define DEC_BLOCK_EPT_ARG partition,
#define DEC_BLOCK(db_r, db_c, db_subsize)                                  \
  block_visit[parse_decode_flag](pbi, td, DEC_BLOCK_STX_ARG(db_r), (db_c), \
                                 reader, DEC_BLOCK_EPT_ARG(db_subsize))
#define DEC_PARTITION(db_r, db_c, db_subsize)                        \
  decode_partition(pbi, td, DEC_BLOCK_STX_ARG(db_r), (db_c), reader, \
                   (db_subsize), parse_decode_flag)

  switch (partition) {
    case PARTITION_NONE: DEC_BLOCK(mi_row, mi_col, subsize); break;
    case PARTITION_HORZ:
      DEC_BLOCK(mi_row, mi_col, subsize);
      if (has_rows) DEC_BLOCK(mi_row + hbs, mi_col, subsize);
      break;
    case PARTITION_VERT:
      DEC_BLOCK(mi_row, mi_col, subsize);
      if (has_cols) DEC_BLOCK(mi_row, mi_col + hbs, subsize);
      break;
    case PARTITION_SPLIT:
      DEC_PARTITION(mi_row, mi_col, subsize);
      DEC_PARTITION(mi_row, mi_col + hbs, subsize);
      DEC_PARTITION(mi_row + hbs, mi_col, subsize);
      DEC_PARTITION(mi_row + hbs, mi_col + hbs, subsize);
      break;
    case PARTITION_HORZ_A:
      DEC_BLOCK(mi_row, mi_col, bsize2);
      DEC_BLOCK(mi_row, mi_col + hbs, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col, subsize);
      break;
    case PARTITION_HORZ_B:
      DEC_BLOCK(mi_row, mi_col, subsize);
      DEC_BLOCK(mi_row + hbs, mi_col, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col + hbs, bsize2);
      break;
    case PARTITION_VERT_A:
      DEC_BLOCK(mi_row, mi_col, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col, bsize2);
      DEC_BLOCK(mi_row, mi_col + hbs, subsize);
      break;
    case PARTITION_VERT_B:
      DEC_BLOCK(mi_row, mi_col, subsize);
      DEC_BLOCK(mi_row, mi_col + hbs, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col + hbs, bsize2);
      break;
    case PARTITION_HORZ_4:
      for (int i = 0; i < 4; ++i) {
        int this_mi_row = mi_row + i * quarter_step;
        if (i > 0 && this_mi_row >= cm->mi_params.mi_rows) break;
        DEC_BLOCK(this_mi_row, mi_col, subsize);
      }
      break;
    case PARTITION_VERT_4:
      for (int i = 0; i < 4; ++i) {
        int this_mi_col = mi_col + i * quarter_step;
        if (i > 0 && this_mi_col >= cm->mi_params.mi_cols) break;
        DEC_BLOCK(mi_row, this_mi_col, subsize);
      }
      break;
    default: assert(0 && "Invalid partition type");
  }

#undef DEC_PARTITION
#undef DEC_BLOCK
#undef DEC_BLOCK_EPT_ARG
#undef DEC_BLOCK_STX_ARG

  if (parse_decode_flag & 1)
    update_ext_partition_context(xd, mi_row, mi_col, subsize, bsize, partition);
}